

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::DoLdLenIntSpec(GlobOpt *this,Instr *instr,ValueType baseValueType)

{
  code *pcVar1;
  bool bVar2;
  ValueType other;
  ObjectType OVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  Opnd *pOVar5;
  JITTimeProfileInfo *this_00;
  ProfiledInstr *pPVar6;
  FldInfo *this_01;
  RegOpnd *pRVar7;
  bool local_37;
  bool local_36;
  bool local_35;
  Instr *instr_local;
  GlobOpt *this_local;
  ValueType baseValueType_local;
  
  this_local._4_2_ = baseValueType.field_0;
  if ((instr != (Instr *)0x0) && (instr->m_opcode != LdLen_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3eab,"(!instr || instr->m_opcode == Js::OpCode::LdLen_A)",
                       "!instr || instr->m_opcode == Js::OpCode::LdLen_A");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((instr != (Instr *)0x0) && (pOVar5 = IR::Instr::GetDst(instr), pOVar5 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3eac,"(!instr || instr->GetDst())","!instr || instr->GetDst()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((instr != (Instr *)0x0) && (pOVar5 = IR::Instr::GetSrc1(instr), pOVar5 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3ead,"(!instr || instr->GetSrc1())","!instr || instr->GetSrc1()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,LdLenIntSpecPhase,sourceContextId,functionId);
  if ((!bVar2) && (bVar2 = IsTypeSpecPhaseOff(this->func), !bVar2)) {
    bVar2 = Func::HasProfileInfo(this->func);
    if (bVar2) {
      this_00 = Func::GetReadOnlyProfileInfo(this->func);
      bVar2 = JITTimeProfileInfo::IsLdLenIntSpecDisabled(this_00);
      if (bVar2) {
        return false;
      }
    }
    if (((instr == (Instr *)0x0) || (bVar2 = IsLoopPrePass(this), bVar2)) ||
       (bVar2 = IR::Instr::DoStackArgsOpt(instr), !bVar2)) {
      if ((instr != (Instr *)0x0) && (bVar2 = IR::Instr::IsProfiledInstr(instr), bVar2)) {
        pPVar6 = IR::Instr::AsProfiledInstr(instr);
        this_01 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                            ((anon_union_8_4_88fdcd80 *)&(pPVar6->u).field_3);
        bVar2 = ValueType::IsLikelyInt(&this_01->valueType);
        if (bVar2) {
          pOVar5 = IR::Instr::GetDst(instr);
          pRVar7 = IR::Opnd::AsRegOpnd(pOVar5);
          if ((*(uint *)&pRVar7->m_sym->field_0x18 >> 1 & 1) == 0) goto LAB_005a8c04;
        }
        return false;
      }
LAB_005a8c04:
      local_35 = true;
      if (instr != (Instr *)0x0) {
        pOVar5 = IR::Instr::GetSrc1(instr);
        other = IR::Opnd::GetValueType(pOVar5);
        local_35 = ValueType::operator==((ValueType *)((long)&this_local + 4),other);
      }
      if (((local_35 ^ 0xffU) & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3ec1,"(!instr || baseValueType == instr->GetSrc1()->GetValueType())",
                           "!instr || baseValueType == instr->GetSrc1()->GetValueType()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      bVar2 = ValueType::HasBeenString((ValueType *)((long)&this_local + 4));
      local_36 = true;
      if (!bVar2) {
        bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)((long)&this_local + 4));
        local_37 = false;
        if (bVar2) {
          OVar3 = ValueType::GetObjectType((ValueType *)((long)&this_local + 4));
          local_37 = OVar3 != ObjectWithArray;
        }
        local_36 = local_37;
      }
      return local_36;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoLdLenIntSpec(IR::Instr * const instr, const ValueType baseValueType)
{
    Assert(!instr || instr->m_opcode == Js::OpCode::LdLen_A);
    Assert(!instr || instr->GetDst());
    Assert(!instr || instr->GetSrc1());

    if(PHASE_OFF(Js::LdLenIntSpecPhase, func) ||
        IsTypeSpecPhaseOff(func) ||
        (func->HasProfileInfo() && func->GetReadOnlyProfileInfo()->IsLdLenIntSpecDisabled()) ||
        (instr && !IsLoopPrePass() && instr->DoStackArgsOpt()))
    {
        return false;
    }

    if(instr &&
        instr->IsProfiledInstr() &&
        (
            !instr->AsProfiledInstr()->u.FldInfo().valueType.IsLikelyInt() ||
            instr->GetDst()->AsRegOpnd()->m_sym->m_isNotNumber
        ))
    {
        return false;
    }

    Assert(!instr || baseValueType == instr->GetSrc1()->GetValueType());
    return
        baseValueType.HasBeenString() ||
        (baseValueType.IsLikelyAnyOptimizedArray() && baseValueType.GetObjectType() != ObjectType::ObjectWithArray);
}